

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZEllipse3D::GradX<double>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double dVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  int i_1;
  double dVar4;
  double dVar5;
  double dVar6;
  TPZFMatrix<double> axloc;
  TPZFNMatrix<3,_double> dxcoloc;
  TPZFNMatrix<3,_double> dxcoglob;
  TPZFMatrix<double> local_220;
  TPZFMatrix<double> local_190;
  double local_100 [4];
  TPZFMatrix<double> local_e0;
  double local_50 [4];
  
  dVar4 = this->fAngleIni;
  dVar6 = this->fAngleFinal;
  dVar1 = *par->fStore;
  local_190.fElem = local_100;
  local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186ce28;
  local_190.fSize = 3;
  local_190.fGiven = local_190.fElem;
  TPZVec<int>::TPZVec(&local_190.fPivot.super_TPZVec<int>,0);
  local_190.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_190.fPivot.super_TPZVec<int>.fStore = local_190.fPivot.fExtAlloc;
  local_190.fPivot.super_TPZVec<int>.fNElements = 0;
  local_190.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_190.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_190.fWork.fStore = (double *)0x0;
  local_190.fWork.fNElements = 0;
  local_190.fWork.fNAlloc = 0;
  local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186cb38;
  TPZFMatrix<double>::operator=(&local_190,0.0);
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186ce28;
  local_e0.fSize = 3;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186cb38;
  TPZFMatrix<double>::operator=(&local_e0,0.0);
  dVar6 = dVar6 - dVar4;
  dVar4 = (dVar1 + 1.0) * 0.5 * dVar6 + dVar4;
  dVar1 = this->fsAxeX;
  dVar5 = sin(dVar4);
  if ((local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_190.fElem = dVar5 * -dVar1;
  dVar1 = this->fsAxeY;
  dVar4 = cos(dVar4);
  if ((1 < local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (0 < local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_190.fElem[1] = dVar1 * dVar4;
    local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_220.fElem = (double *)0x0;
    local_220.fGiven = (double *)0x0;
    local_220.fSize = 0;
    TPZVec<int>::TPZVec(&local_220.fPivot.super_TPZVec<int>,0);
    local_220.fPivot.super_TPZVec<int>.fStore = local_220.fPivot.fExtAlloc;
    local_220.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_220.fPivot.super_TPZVec<int>.fNElements = 0;
    local_220.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_220.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_220.fWork.fStore = (double *)0x0;
    local_220.fWork.fNElements = 0;
    local_220.fWork.fNAlloc = 0;
    local_220.fElem = (double *)operator_new__(0x48);
    lVar3 = 0;
    do {
      lVar2 = 0;
      do {
        if ((local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_220.fElem[local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar2 + lVar3]
             = (this->fAxes).super_TPZFMatrix<double>.fElem
               [(this->fAxes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow * lVar2 + lVar3];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    TPZFMatrix<double>::MultAdd(&local_220,&local_190,&local_190,&local_e0,1.0,0.0,1);
    lVar3 = 0;
    while( true ) {
      if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
         (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) break;
      gradx->fElem[lVar3] = local_e0.fElem[lVar3] * dVar6 * 0.5;
      lVar3 = lVar3 + 1;
      if (lVar3 == 3) {
        TPZFMatrix<double>::~TPZFMatrix(&local_220);
        TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_0186cdf0);
        TPZFMatrix<double>::~TPZFMatrix(&local_190,&PTR_PTR_0186cdf0);
        return;
      }
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}